

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_log_sync_req(raft_server *this,req_msg *req)

{
  log_val_type lVar1;
  int __fd;
  element_type *this_00;
  socklen_t *__addr_len;
  size_type sVar2;
  element_type *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  allocator<char> *__a;
  element_type *peVar3;
  ulong uVar4;
  log_entry *this_03;
  buffer *pbVar5;
  element_type *this_04;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar7;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *entries;
  ptr<resp_msg> *resp;
  int *in_stack_fffffffffffffef0;
  int *in_stack_fffffffffffffef8;
  msg_type *in_stack_ffffffffffffff00;
  unsigned_long *in_stack_ffffffffffffff08;
  allocator<char> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  allocator<char> *__s;
  raft_server *in_stack_ffffffffffffff30;
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [48];
  int32 local_38;
  undefined4 local_34;
  ulong local_30;
  undefined1 local_21;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *local_20;
  req_msg *local_18;
  
  local_18 = in_RDX;
  local_20 = req_msg::log_entries(in_RDX);
  local_21 = 0;
  this_00 = std::
            __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d7da7);
  local_30 = srv_state::get_term(this_00);
  local_34 = 0xb;
  __addr_len = (socklen_t *)(in_RSI + 0xc);
  local_38 = msg_base::get_src(&local_18->super_msg_base);
  cs_new<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0);
  sVar2 = std::
          vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
          ::size(local_20);
  if (sVar2 == 1) {
    std::
    vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
    ::operator[](local_20,0);
    this_01 = std::
              __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d7e3a);
    lVar1 = log_entry::get_val_type(this_01);
    if (lVar1 == log_pack) {
      if ((*(byte *)(in_RSI + 0x2a) & 1) == 0) {
        __a = (allocator<char> *)
              std::
              __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d7f64);
        __s = &local_91;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff30,(char *)__s,__a);
        (**(code **)(*(long *)__a + 0x18))(__a,local_90);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator(&local_91);
        _Var6._M_pi = extraout_RDX_00;
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d803a);
        uVar4 = req_msg::get_last_log_idx(local_18);
        this_03 = (log_entry *)(uVar4 + 1);
        std::
        vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ::operator[](local_20,0);
        std::__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1d8079);
        pbVar5 = log_entry::get_buf(this_03);
        (*peVar3->_vptr_log_store[0xb])(peVar3,this_03,pbVar5);
        peVar3 = std::
                 __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d80b3);
        (*peVar3->_vptr_log_store[2])();
        commit(in_stack_ffffffffffffff30,(ulong)in_stack_ffffffffffffff28);
        this_04 = std::
                  __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d80e4);
        peVar3 = std::
                 __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d80f9);
        __fd = (*peVar3->_vptr_log_store[2])();
        resp_msg::accept(this_04,__fd,__addr,__addr_len);
        _Var6._M_pi = extraout_RDX_01;
      }
      goto LAB_001d812f;
    }
  }
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d7e66);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  (**(code **)(*(long *)this_02 + 0x18))(this_02,local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  _Var6._M_pi = extraout_RDX;
LAB_001d812f:
  pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_log_sync_req(req_msg& req)
{
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::sync_log_response, id_, req.get_src()));
    if (entries.size() != 1 || entries[0]->get_val_type() != log_val_type::log_pack)
    {
        l_->info("receive an invalid LogSyncRequest as the log entry value doesn't meet the requirements");
        return resp;
    }

    if (!catching_up_)
    {
        l_->info("This server is ready for cluster, ignore the request");
        return resp;
    }

    log_store_->apply_pack(req.get_last_log_idx() + 1, entries[0]->get_buf());
    commit(log_store_->next_slot() - 1);
    resp->accept(log_store_->next_slot());
    return resp;
}